

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

Maybe<capnp::InterfaceSchema> __thiscall
capnp::InterfaceSchema::findSuperclass(InterfaceSchema *this,uint64_t typeId,uint *counter)

{
  uint uVar1;
  bool bVar2;
  unsigned_long *puVar3;
  uint64_t id;
  NullableValue<capnp::InterfaceSchema> *other;
  InterfaceSchema *pIVar4;
  InterfaceSchema *t;
  uint *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 aVar5;
  Maybe<capnp::InterfaceSchema> MVar6;
  Schema local_168;
  Schema local_160;
  Maybe<capnp::InterfaceSchema> local_158;
  undefined1 local_148 [8];
  NullableValue<capnp::InterfaceSchema> result;
  undefined1 local_130 [4];
  uint location;
  Reader superclass;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  Reader local_a0;
  undefined1 local_70 [8];
  Reader superclasses;
  Fault local_30;
  Fault f;
  uint *counter_local;
  uint64_t typeId_local;
  InterfaceSchema *this_local;
  
  uVar1 = *in_RCX;
  *in_RCX = uVar1 + 1;
  if (uVar1 < 0x40) {
    if (counter == *(uint **)**(undefined8 **)typeId) {
      kj::Maybe<capnp::InterfaceSchema>::Maybe
                ((Maybe<capnp::InterfaceSchema> *)this,(InterfaceSchema *)typeId);
      aVar5 = extraout_RDX_00;
    }
    else {
      Schema::getProto((Reader *)&__range1,(Schema *)typeId);
      capnp::schema::Node::Reader::getInterface(&local_a0,(Reader *)&__range1);
      capnp::schema::Node::Interface::Reader::getSuperclasses((Reader *)local_70,&local_a0);
      ___begin1 = kj::indices<capnp::List<capnp::schema::Superclass,(capnp::Kind)3>::Reader&>
                            ((Reader *)local_70);
      __end1 = kj::Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
      i = (unsigned_long)kj::Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
      while (bVar2 = kj::Range<unsigned_long>::Iterator::operator!=(&__end1,(Iterator *)&i), bVar2)
      {
        puVar3 = kj::Range<unsigned_long>::Iterator::operator*(&__end1);
        superclass._reader._40_8_ = *puVar3;
        List<capnp::schema::Superclass,_(capnp::Kind)3>::Reader::operator[]
                  ((Reader *)local_130,(Reader *)local_70,superclass._reader.nestingLimit);
        result.field_1._4_4_ =
             capnp::_::RawBrandedSchema::makeDepLocation(SUPERCLASS,superclass._reader.nestingLimit)
        ;
        id = capnp::schema::Superclass::Reader::getId((Reader *)local_130);
        local_168 = Schema::getDependency((Schema *)typeId,id,result.field_1._4_4_);
        local_160.raw = (RawBrandedSchema *)Schema::asInterface(&local_168);
        findSuperclass((InterfaceSchema *)&local_158,(uint64_t)&local_160,counter);
        other = kj::_::readMaybe<capnp::InterfaceSchema>(&local_158);
        kj::_::NullableValue<capnp::InterfaceSchema>::NullableValue
                  ((NullableValue<capnp::InterfaceSchema> *)local_148,other);
        kj::Maybe<capnp::InterfaceSchema>::~Maybe(&local_158);
        pIVar4 = kj::_::NullableValue::operator_cast_to_InterfaceSchema_((NullableValue *)local_148)
        ;
        if (pIVar4 != (InterfaceSchema *)0x0) {
          t = kj::_::NullableValue<capnp::InterfaceSchema>::operator*
                        ((NullableValue<capnp::InterfaceSchema> *)local_148);
          kj::Maybe<capnp::InterfaceSchema>::Maybe((Maybe<capnp::InterfaceSchema> *)this,t);
        }
        kj::_::NullableValue<capnp::InterfaceSchema>::~NullableValue
                  ((NullableValue<capnp::InterfaceSchema> *)local_148);
        aVar5 = extraout_RDX_01;
        if (pIVar4 != (InterfaceSchema *)0x0) goto LAB_0080d911;
        kj::Range<unsigned_long>::Iterator::operator++(&__end1);
      }
      kj::Maybe<capnp::InterfaceSchema>::Maybe((Maybe<capnp::InterfaceSchema> *)this,(void *)0x0);
      aVar5 = extraout_RDX_02;
    }
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[53]>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x288,FAILED,"counter++ < MAX_SUPERCLASSES",
               "\"Cyclic or absurdly-large inheritance graph detected.\"",
               (char (*) [53])"Cyclic or absurdly-large inheritance graph detected.");
    kj::Maybe<capnp::InterfaceSchema>::Maybe((Maybe<capnp::InterfaceSchema> *)this,(void *)0x0);
    kj::_::Debug::Fault::~Fault(&local_30);
    aVar5 = extraout_RDX;
  }
LAB_0080d911:
  MVar6.ptr.field_1 = aVar5;
  MVar6.ptr._0_8_ = this;
  return (Maybe<capnp::InterfaceSchema>)MVar6.ptr;
}

Assistant:

kj::Maybe<InterfaceSchema> InterfaceSchema::findSuperclass(uint64_t typeId, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return nullptr;
  }

  if (typeId == raw->generic->id) {
    return *this;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    KJ_IF_MAYBE(result, getDependency(superclass.getId(), location).asInterface()
                            .findSuperclass(typeId, counter)) {
      return *result;
    }
  }

  return nullptr;
}